

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O3

int AF_A_FireMissile(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AWeapon *this;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  void *pvVar6;
  PClassActor *type;
  uint uVar7;
  AActor *source;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bd6fe;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005bd6ee;
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_005bd5c5;
    pPVar5 = (source->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (source->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar9 = pPVar5 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar9;
    bVar10 = pPVar5 == pPVar3;
    if (!bVar10 && !bVar9) {
      do {
        pPVar5 = pPVar5->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
    uVar7 = (uint)bVar9;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005bd6fe;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_005bd6ee;
LAB_005bd5c5:
    source = (AActor *)0x0;
    pVVar8 = param;
    uVar7 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005bd6ee:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005bd6fe;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar5 = (PClass *)puVar2[1];
          if (pPVar5 == (PClass *)0x0) {
            pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
            puVar2[1] = pPVar5;
          }
          bVar9 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar3 && bVar9) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar9 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar3) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar9) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005bd6fe;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005bd6ee;
    }
    if ((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar6 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_005bd689;
        if (pvVar6 == (void *)0x0) goto LAB_005bd687;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005bd6fe:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1cb,"int AF_A_FireMissile(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_005bd687:
  pvVar6 = (void *)0x0;
LAB_005bd689:
  if (source->player != (player_t *)0x0) {
    this = source->player->ReadyWeapon;
    if (((pvVar6 != (void *)0x0 && this != (AWeapon *)0x0) && (*(int *)((long)pvVar6 + 8) == 1)) &&
       (bVar9 = AWeapon::DepleteAmmo(this,this->bAltFire,true,1), !bVar9)) {
      return 0;
    }
    type = PClass::FindActor("Rocket");
    P_SpawnPlayerMissile(source,type);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireMissile)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;
	}
	P_SpawnPlayerMissile (self, PClass::FindActor("Rocket"));
	return 0;
}